

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O1

int av1_is_min_tile_width_satisfied(AV1_COMMON *cm)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((cm->tiles).cols != 1) {
    uVar1 = (uint)(0x40 << (cm->width != cm->superres_upscaled_width) <=
                  (cm->tiles).min_inner_width * 4);
  }
  return uVar1;
}

Assistant:

int av1_is_min_tile_width_satisfied(const AV1_COMMON *cm) {
  // Disable check if there is a single tile col in the frame
  if (cm->tiles.cols == 1) return 1;

  return ((cm->tiles.min_inner_width << MI_SIZE_LOG2) >=
          (64 << av1_superres_scaled(cm)));
}